

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

bool VulkanUtilities::SetupDebugUtils
               (VkInstance instance,VkDebugUtilsMessageSeverityFlagsEXT messageSeverity,
               VkDebugUtilsMessageTypeFlagsEXT messageType,uint32_t IgnoreMessageCount,
               char **ppIgnoreMessageNames,void *pUserData)

{
  Char *pCVar1;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false> Args_1;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false,_false>,_bool>
  pVar2;
  undefined1 local_180 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  int local_cc;
  HashMapStringKey local_c8;
  uint local_b4;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
  _Stack_b0;
  uint32_t i;
  undefined1 local_a8;
  int local_a0 [4];
  undefined1 local_90 [8];
  string msg;
  undefined4 local_68;
  VkResult err;
  VkDebugUtilsMessengerCreateInfoEXT DbgMessenger_CI;
  void *pUserData_local;
  char **ppIgnoreMessageNames_local;
  uint32_t IgnoreMessageCount_local;
  VkDebugUtilsMessageTypeFlagsEXT messageType_local;
  VkDebugUtilsMessageSeverityFlagsEXT messageSeverity_local;
  VkInstance instance_local;
  
  DbgMessenger_CI.pUserData = pUserData;
  (anonymous_namespace)::CreateDebugUtilsMessengerEXT =
       (*vkGetInstanceProcAddr)(instance,"vkCreateDebugUtilsMessengerEXT");
  (anonymous_namespace)::DestroyDebugUtilsMessengerEXT =
       (long)(*vkGetInstanceProcAddr)(instance,"vkDestroyDebugUtilsMessengerEXT");
  if (((anonymous_namespace)::CreateDebugUtilsMessengerEXT == (PFN_vkVoidFunction)0x0) ||
     ((PFN_vkVoidFunction)(anonymous_namespace)::DestroyDebugUtilsMessengerEXT ==
      (PFN_vkVoidFunction)0x0)) {
    instance_local._7_1_ = false;
  }
  else {
    memset(&local_68,0,0x30);
    local_68 = 0x3b9cbe04;
    DbgMessenger_CI.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    DbgMessenger_CI._4_4_ = 0;
    DbgMessenger_CI.pNext._0_4_ = 0;
    DbgMessenger_CI._24_8_ = anon_unknown_0::DebugMessengerCallback;
    DbgMessenger_CI.pfnUserCallback =
         (PFN_vkDebugUtilsMessengerCallbackEXT)DbgMessenger_CI.pUserData;
    Args_1._M_cur = (__node_type *)&(anonymous_namespace)::DbgMessenger;
    DbgMessenger_CI.pNext._4_4_ = messageSeverity;
    DbgMessenger_CI.flags = messageType;
    msg.field_2._12_4_ =
         (*(anonymous_namespace)::CreateDebugUtilsMessengerEXT)(instance,&local_68,0);
    if (msg.field_2._12_4_ != 0) {
      Diligent::FormatString<char[39]>
                ((string *)local_90,(char (*) [39])"Failed to create debug utils messenger");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Args_1._M_cur = (__node_type *)0xdc;
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xdc);
      std::__cxx11::string::~string((string *)local_90);
    }
    std::
    unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
    ::clear((unordered_map<Diligent::HashMapStringKey,_std::atomic<int>,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>_>_>
             *)(anonymous_namespace)::g_IgnoreMessages);
    local_a0[0] = 0;
    pVar2 = std::
            unordered_map<Diligent::HashMapStringKey,std::atomic<int>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>>
            ::emplace<char_const(&)[55],int>
                      ((unordered_map<Diligent::HashMapStringKey,std::atomic<int>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>>
                        *)(anonymous_namespace)::g_IgnoreMessages,
                       (char (*) [55])"UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw",
                       local_a0);
    _Stack_b0._M_cur =
         (__node_type *)
         pVar2.first.
         super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
         ._M_cur;
    local_a8 = pVar2.second;
    for (local_b4 = 0; local_b4 < IgnoreMessageCount; local_b4 = local_b4 + 1) {
      Diligent::HashMapStringKey::HashMapStringKey(&local_c8,ppIgnoreMessageNames[local_b4],true);
      local_cc = 0;
      pVar2 = std::
              unordered_map<Diligent::HashMapStringKey,std::atomic<int>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>>
              ::emplace<Diligent::HashMapStringKey,int>
                        ((unordered_map<Diligent::HashMapStringKey,std::atomic<int>,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::atomic<int>>>>
                          *)(anonymous_namespace)::g_IgnoreMessages,&local_c8,&local_cc);
      Args_1._M_cur =
           (__node_type *)
           pVar2.first.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_std::atomic<int>_>,_false>
           ._M_cur;
      Diligent::HashMapStringKey::~HashMapStringKey(&local_c8);
    }
    (anonymous_namespace)::SetDebugUtilsObjectNameEXT =
         (*vkGetInstanceProcAddr)(instance,"vkSetDebugUtilsObjectNameEXT");
    if ((anonymous_namespace)::SetDebugUtilsObjectNameEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[38]>
                ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SetDebugUtilsObjectNameEXT != nullptr",(char (*) [38])Args_1._M_cur
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Args_1._M_cur = (__node_type *)0xe9;
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xe9);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    (anonymous_namespace)::SetDebugUtilsObjectTagEXT =
         (*vkGetInstanceProcAddr)(instance,"vkSetDebugUtilsObjectTagEXT");
    if ((anonymous_namespace)::SetDebugUtilsObjectTagEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[37]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SetDebugUtilsObjectTagEXT != nullptr",(char (*) [37])Args_1._M_cur)
      ;
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Args_1._M_cur = (__node_type *)0xeb;
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xeb);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    (anonymous_namespace)::QueueBeginDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueBeginDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueBeginDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[40]>
                ((string *)((long)&msg_4.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueBeginDebugUtilsLabelEXT != nullptr",
                 (char (*) [40])Args_1._M_cur);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Args_1._M_cur = (__node_type *)0xee;
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xee);
      std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
    }
    (anonymous_namespace)::QueueEndDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueEndDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueEndDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[38]>
                ((string *)((long)&msg_5.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueEndDebugUtilsLabelEXT != nullptr",(char (*) [38])Args_1._M_cur
                );
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Args_1._M_cur = (__node_type *)0xf0;
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xf0);
      std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
    }
    (anonymous_namespace)::QueueInsertDebugUtilsLabelEXT =
         (*vkGetInstanceProcAddr)(instance,"vkQueueInsertDebugUtilsLabelEXT");
    if ((anonymous_namespace)::QueueInsertDebugUtilsLabelEXT == (PFN_vkVoidFunction)0x0) {
      Diligent::FormatString<char[26],char[41]>
                ((string *)local_180,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueueInsertDebugUtilsLabelEXT != nullptr",
                 (char (*) [41])Args_1._M_cur);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      Diligent::DebugAssertionFailed
                (pCVar1,"SetupDebugUtils",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0xf2);
      std::__cxx11::string::~string((string *)local_180);
    }
    instance_local._7_1_ = msg.field_2._12_4_ == 0;
  }
  return instance_local._7_1_;
}

Assistant:

bool SetupDebugUtils(VkInstance                          instance,
                     VkDebugUtilsMessageSeverityFlagsEXT messageSeverity,
                     VkDebugUtilsMessageTypeFlagsEXT     messageType,
                     uint32_t                            IgnoreMessageCount,
                     const char* const*                  ppIgnoreMessageNames,
                     void*                               pUserData)
{
    CreateDebugUtilsMessengerEXT  = reinterpret_cast<PFN_vkCreateDebugUtilsMessengerEXT>(vkGetInstanceProcAddr(instance, "vkCreateDebugUtilsMessengerEXT"));
    DestroyDebugUtilsMessengerEXT = reinterpret_cast<PFN_vkDestroyDebugUtilsMessengerEXT>(vkGetInstanceProcAddr(instance, "vkDestroyDebugUtilsMessengerEXT"));
    if (CreateDebugUtilsMessengerEXT == nullptr || DestroyDebugUtilsMessengerEXT == nullptr)
        return false;

    VkDebugUtilsMessengerCreateInfoEXT DbgMessenger_CI{};
    DbgMessenger_CI.sType           = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
    DbgMessenger_CI.pNext           = NULL;
    DbgMessenger_CI.flags           = 0;
    DbgMessenger_CI.messageSeverity = messageSeverity;
    DbgMessenger_CI.messageType     = messageType;
    DbgMessenger_CI.pfnUserCallback = DebugMessengerCallback;
    DbgMessenger_CI.pUserData       = pUserData;

    auto err = CreateDebugUtilsMessengerEXT(instance, &DbgMessenger_CI, nullptr, &DbgMessenger);
    VERIFY(err == VK_SUCCESS, "Failed to create debug utils messenger");

    g_IgnoreMessages.clear();
    // UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw:
    // vkCmdClearAttachments() issued on command buffer object 0x... prior to any Draw Cmds. It is recommended you use RenderPass LOAD_OP_CLEAR on Attachments prior to any Draw.
    g_IgnoreMessages.emplace("UNASSIGNED-CoreValidation-DrawState-ClearCmdBeforeDraw", 0);
    for (uint32_t i = 0; i < IgnoreMessageCount; ++i)
    {
        g_IgnoreMessages.emplace(HashMapStringKey{ppIgnoreMessageNames[i], true}, 0);
    }

    // Load function pointers
    SetDebugUtilsObjectNameEXT = reinterpret_cast<PFN_vkSetDebugUtilsObjectNameEXT>(vkGetInstanceProcAddr(instance, "vkSetDebugUtilsObjectNameEXT"));
    VERIFY_EXPR(SetDebugUtilsObjectNameEXT != nullptr);
    SetDebugUtilsObjectTagEXT = reinterpret_cast<PFN_vkSetDebugUtilsObjectTagEXT>(vkGetInstanceProcAddr(instance, "vkSetDebugUtilsObjectTagEXT"));
    VERIFY_EXPR(SetDebugUtilsObjectTagEXT != nullptr);

    QueueBeginDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueBeginDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueBeginDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueBeginDebugUtilsLabelEXT != nullptr);
    QueueEndDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueEndDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueEndDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueEndDebugUtilsLabelEXT != nullptr);
    QueueInsertDebugUtilsLabelEXT = reinterpret_cast<PFN_vkQueueInsertDebugUtilsLabelEXT>(vkGetInstanceProcAddr(instance, "vkQueueInsertDebugUtilsLabelEXT"));
    VERIFY_EXPR(QueueInsertDebugUtilsLabelEXT != nullptr);

    return err == VK_SUCCESS;
}